

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleQueue.hpp
# Opt level: O0

optional<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_> __thiscall
gmlc::containers::
SimpleQueue<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::mutex>::
pop(SimpleQueue<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::mutex>
    *this)

{
  bool bVar1;
  undefined8 extraout_RDX;
  long in_RSI;
  _Storage<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_false> in_RDI;
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  *this_00;
  optional<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_> oVar2;
  lock_guard<std::mutex> pullLock;
  optional<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_> *val;
  mutex_type *in_stack_ffffffffffffffa8;
  lock_guard<std::mutex> *in_stack_ffffffffffffffb0;
  _Storage<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_false> this_01;
  SimpleQueue<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::mutex>
  *in_stack_ffffffffffffffe0;
  
  this_01 = in_RDI;
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  checkPullandSwap(in_stack_ffffffffffffffe0);
  bVar1 = std::atomic::operator_cast_to_bool((atomic<bool> *)this_01);
  if (bVar1) {
    std::optional<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>::
    optional((optional<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_> *)
             this_01);
  }
  else {
    this_00 = (vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
               *)(in_RSI + 0x68);
    CLI::std::
    vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
    ::back(this_00);
    std::optional<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>::
    optional<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_true>
              ((optional<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_> *
               )this_00,(unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                        in_stack_ffffffffffffffa8);
    std::
    vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
    ::pop_back((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                *)0x2802df);
    checkPullandSwap(in_stack_ffffffffffffffe0);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x280331);
  oVar2.
  super__Optional_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>
  ._8_8_ = extraout_RDX;
  oVar2.
  super__Optional_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>
  ._M_payload = in_RDI;
  return (optional<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>)
         oVar2.
         super__Optional_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>
  ;
}

Assistant:

std::optional<X> pop()
        {
            std::lock_guard<MUTEX> pullLock(m_pullLock);  // first pullLock
            checkPullandSwap();
            if (queueEmptyFlag) {
                return std::nullopt;
            }
            std::optional<X> val(
                std::move(pullElements.back()));  // do it this way to
                                                  // allow moveable only
                                                  // types
            pullElements.pop_back();
            checkPullandSwap();
            return val;
        }